

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaligned_vectorization.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  __m256d c;
  __m256d b;
  __m256d a;
  double result [4];
  double input2 [4];
  double input1 [4];
  undefined1 local_120 [8];
  double dStack_118;
  double dStack_110;
  double dStack_108;
  double local_100;
  double dStack_f8;
  double dStack_f0;
  double dStack_e8;
  double local_e0;
  double dStack_d8;
  double dStack_d0;
  double dStack_c8;
  undefined4 local_b4;
  double *local_b0;
  double *local_a8;
  double local_a0;
  double dStack_98;
  double dStack_90;
  double dStack_88;
  double local_80;
  double dStack_78;
  double dStack_70;
  double dStack_68;
  double local_60;
  double dStack_58;
  double dStack_50;
  double dStack_48;
  undefined1 *local_38;
  
  local_b4 = 0;
  local_e0 = 1.0;
  dStack_d8 = 1.0;
  dStack_d0 = 1.0;
  dStack_c8 = 1.0;
  local_100 = 1.0;
  dStack_f8 = 2.0;
  dStack_f0 = 3.0;
  dStack_e8 = 4.0;
  poVar1 = std::operator<<((ostream *)&std::cout,"address of input1: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,&local_e0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"address of input2: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,&local_100);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_a8 = &local_e0;
  local_80 = local_e0;
  dStack_78 = dStack_d8;
  dStack_70 = dStack_d0;
  dStack_68 = dStack_c8;
  local_b0 = &local_100;
  local_a0 = local_100;
  dStack_98 = dStack_f8;
  dStack_90 = dStack_f0;
  dStack_88 = dStack_e8;
  local_60 = local_e0 + local_100;
  dStack_118 = dStack_d8 + dStack_f8;
  dStack_110 = dStack_d0 + dStack_f0;
  dStack_108 = dStack_c8 + dStack_e8;
  local_38 = local_120;
  dStack_58 = dStack_118;
  dStack_50 = dStack_110;
  dStack_48 = dStack_108;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_60);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dStack_118);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dStack_110);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dStack_108);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main() {

  double input1[4] = {1, 1, 1, 1};
  double input2[4] = {1, 2, 3, 4};
  double result[4];

  std::cout << "address of input1: " << input1 << std::endl;
  std::cout << "address of input2: " << input2 << std::endl;

  __m256d a = _mm256_load_pd(input1);
  __m256d b = _mm256_load_pd(input2);
  __m256d c = _mm256_add_pd(a, b);

  _mm256_store_pd(result, c);

  std::cout << result[0] << " " << result[1] << " " << result[2] << " " << result[3] << std::endl;

  return 0;
}